

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O3

void printDstIdx(MCInst *MI,uint Op,SStream *O)

{
  uint8_t *puVar1;
  byte bVar2;
  cs_detail *pcVar3;
  uint id;
  cs_struct *pcVar4;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  SStream *ss;
  uint8_t access [6];
  uint8_t local_1e [6];
  
  ss = (SStream *)CONCAT44(in_register_00000034,Op);
  pcVar4 = MI->csh;
  if (pcVar4->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x55;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    pcVar3->groups[(ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x75] = MI->x86opsize;
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x5d;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x61;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x65;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x69;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x6d;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    pcVar4 = MI->csh;
    id = MCInst_getOpcode(MI);
    get_op_access(pcVar4,id,local_1e,&(MI->flat_insn->detail->field_6).x86.field_15.eflags);
    pcVar3 = MI->flat_insn->detail;
    bVar2 = (pcVar3->field_6).x86.op_count;
    O = (SStream *)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_1e[bVar2]);
    pcVar3->groups[(ulong)((uint)bVar2 * 0x30) + 0x76] = local_1e[bVar2];
    pcVar4 = MI->csh;
  }
  if (pcVar4->mode == CS_MODE_64) {
    SStream_concat(ss,"[",O);
  }
  else {
    SStream_concat(ss,"es:[",O);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar3 = MI->flat_insn->detail;
      puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x5d;
      puVar1[0] = '\x1c';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
  }
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = true;
  }
  printOperand(MI,0,ss);
  SStream_concat0(ss,"]");
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = false;
    puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printDstIdx(MCInst *MI, unsigned Op, SStream *O)
{
	if (MI->csh->detail) {
		uint8_t access[6];

		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->x86opsize;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.index = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = 1;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = 0;

		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].access = access[MI->flat_insn->detail->x86.op_count];
	}

	// DI accesses are always ES-based on non-64bit mode
	if (MI->csh->mode != CS_MODE_64) {
		SStream_concat0(O, "%es:(");
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_ES;
		}
	} else
		SStream_concat0(O, "(");

	set_mem_access(MI, true);

	printOperand(MI, Op, O);

	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}